

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QList<QSimplexVariable_*> * __thiscall
QSet<QSimplexVariable_*>::values(QSet<QSimplexVariable_*> *this)

{
  long lVar1;
  bool bVar2;
  QSet<QSimplexVariable_*> *in_RSI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000018;
  QList<QSimplexVariable_*> *result;
  const_iterator i;
  parameter_type this_00;
  QList<QSimplexVariable_*> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->result)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->index = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].result = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QSimplexVariable_*>::QList((QList<QSimplexVariable_*> *)0xa5e010);
  size((QSet<QSimplexVariable_*> *)0xa5e01a);
  QList<QSimplexVariable_*>::reserve(in_stack_ffffffffffffffd8,in_stack_00000018);
  constBegin(in_RSI);
  while( true ) {
    constEnd(in_RSI);
    bVar2 = const_iterator::operator!=((const_iterator *)this_00,(const_iterator *)in_RDI);
    if (!bVar2) break;
    const_iterator::operator*((const_iterator *)0xa5e07c);
    QList<QSimplexVariable_*>::append((QList<QSimplexVariable_*> *)0xa5e089,in_RDI);
    const_iterator::operator++((const_iterator *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QSimplexVariable_*> *)in_RDI;
}

Assistant:

Q_OUTOFLINE_TEMPLATE QList<T> QSet<T>::values() const
{
    QList<T> result;
    result.reserve(size());
    typename QSet<T>::const_iterator i = constBegin();
    while (i != constEnd()) {
        result.append(*i);
        ++i;
    }
    return result;
}